

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O0

void sqlcheck::CheckGenericPrimaryKey
               (Configuration *state,string *sql_statement,bool *print_statement)

{
  char *pcVar1;
  bool bVar2;
  allocator local_c9;
  string local_c8;
  string local_a8;
  char *local_88;
  char *message;
  PatternType pattern_type;
  allocator local_69;
  string local_68 [8];
  string title;
  regex pattern;
  bool ddl_statement;
  bool *print_statement_local;
  string *sql_statement_local;
  Configuration *state_local;
  
  bVar2 = IsDDLStatement(sql_statement);
  if (bVar2) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)((long)&title.field_2 + 8),
               "(\\s+[\\(]?id\\s+)|(,id\\s+)|(\\s+id\\s+serial)",0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"Generic Primary Key",&local_69);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    message._0_4_ = 2;
    local_88 = anon_var_dwarf_90059;
    std::__cxx11::string::string((string *)&local_a8,local_68);
    pcVar1 = local_88;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c8,pcVar1,&local_c9);
    CheckPattern(state,sql_statement,print_statement,(regex *)((long)&title.field_2 + 8),
                 RISK_LEVEL_HIGH,PATTERN_TYPE_LOGICAL_DATABASE_DESIGN,&local_a8,&local_c8,true,0);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)((long)&title.field_2 + 8));
  }
  return;
}

Assistant:

void CheckGenericPrimaryKey(Configuration& state,
                            const std::string& sql_statement,
                            bool& print_statement){

  auto ddl_statement = IsDDLStatement(sql_statement);
  if(ddl_statement == false){
    return;
  }

  std::regex pattern("(\\s+[\\(]?id\\s+)|(,id\\s+)|(\\s+id\\s+serial)");
  std::string title = "Generic Primary Key";
  PatternType pattern_type = PatternType::PATTERN_TYPE_LOGICAL_DATABASE_DESIGN;

  auto message =
      "● Skip using a generic primary key (id):  "
      "Adding an id column to every table causes several effects that make its "
      "use seem arbitrary. You might end up creating a redundant key or allow "
      "duplicate rows if you add this column in a compound key. "
      "The name id is so generic that it holds no meaning. This is especially "
      "important when you join two tables and they have the same primary "
      "key column name.";

  CheckPattern(state,
               sql_statement,
               print_statement,
               pattern,
               RISK_LEVEL_HIGH,
               pattern_type,
               title,
               message,
               true);

}